

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

real __thiscall
fasttext::ProductQuantizer::assign_centroid
          (ProductQuantizer *this,real *x,real *c0,uint8_t *code,int32_t d)

{
  real *c;
  real *prVar1;
  ulong uVar2;
  int iVar3;
  real rVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  auVar5 = ZEXT1664(ZEXT816(0) << 0x40);
  if (0 < d) {
    uVar2 = 0;
    do {
      auVar6 = vfmadd231ss_fma(auVar5._0_16_,ZEXT416((uint)(x[uVar2] - c0[uVar2])),
                               ZEXT416((uint)(x[uVar2] - c0[uVar2])));
      auVar5 = ZEXT1664(auVar6);
      uVar2 = uVar2 + 1;
    } while ((uint)d != uVar2);
  }
  rVar4 = auVar5._0_4_;
  *code = '\0';
  if (1 < this->ksub_) {
    prVar1 = c0 + d;
    iVar3 = 1;
    do {
      auVar6 = ZEXT816(0) << 0x40;
      if (0 < d) {
        uVar2 = 0;
        do {
          auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)(x[uVar2] - prVar1[uVar2])),
                                   ZEXT416((uint)(x[uVar2] - prVar1[uVar2])));
          uVar2 = uVar2 + 1;
        } while ((uint)d != uVar2);
      }
      if (auVar6._0_4_ < auVar5._0_4_) {
        *code = (uint8_t)iVar3;
        auVar5 = ZEXT1664(auVar6);
      }
      rVar4 = auVar5._0_4_;
      iVar3 = iVar3 + 1;
      prVar1 = prVar1 + d;
    } while (iVar3 < this->ksub_);
  }
  return rVar4;
}

Assistant:

real ProductQuantizer::assign_centroid(
    const real* x,
    const real* c0,
    uint8_t* code,
    int32_t d) const {
  const real* c = c0;
  real dis = distL2(x, c, d);
  code[0] = 0;
  for (auto j = 1; j < ksub_; j++) {
    c += d;
    real disij = distL2(x, c, d);
    if (disij < dis) {
      code[0] = (uint8_t)j;
      dis = disij;
    }
  }
  return dis;
}